

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNEST.cpp
# Opt level: O0

double __thiscall NEST::LArNEST::GetLinearEnergyTransfer(LArNEST *this,double energy,bool CSDA)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  __type _Var11;
  __type _Var12;
  __type _Var13;
  __type _Var14;
  __type _Var15;
  undefined8 local_28;
  double LET;
  bool CSDA_local;
  double energy_local;
  LArNEST *this_local;
  
  if (CSDA) {
    if (energy < 1.0) {
      if ((energy <= 0.0) || (1.0 <= energy)) {
        local_28 = 0.0;
      }
      else {
        local_28 = 100.0;
      }
    }
    else {
      dVar2 = log10(energy);
      dVar3 = log10(energy);
      _Var11 = std::pow<double,int>(dVar3,2);
      dVar3 = log10(energy);
      _Var12 = std::pow<double,int>(dVar3,3);
      dVar3 = log10(energy);
      _Var13 = std::pow<double,int>(dVar3,4);
      dVar3 = log10(energy);
      _Var14 = std::pow<double,int>(dVar3,5);
      dVar3 = log10(energy);
      _Var15 = std::pow<double,int>(dVar3,6);
      local_28 = _Var15 * 0.031563 +
                 _Var14 * -0.69334 +
                 _Var13 * 6.5069 + _Var12 * -33.405 + _Var11 * 99.361 + dVar2 * -162.97 + 116.7;
    }
  }
  else {
    dVar2 = log10(energy);
    dVar3 = log10(energy);
    dVar3 = pow(dVar3,2.0);
    dVar4 = log10(energy);
    dVar4 = pow(dVar4,3.0);
    dVar5 = log10(energy);
    dVar5 = pow(dVar5,4.0);
    dVar6 = log10(energy);
    dVar6 = pow(dVar6,5.0);
    dVar7 = log10(energy);
    dVar7 = pow(dVar7,6.0);
    dVar8 = log10(energy);
    dVar8 = pow(dVar8,7.0);
    dVar9 = log10(energy);
    dVar9 = pow(dVar9,8.0);
    dVar10 = log10(energy);
    dVar10 = pow(dVar10,9.0);
    local_28 = pow(10.0,dVar10 * 0.00045633 +
                        dVar9 * -0.0058953 +
                        dVar8 * 0.030441 +
                        dVar7 * -0.084659 +
                        dVar6 * 0.15279 +
                        dVar5 * -0.2051 +
                        dVar4 * 0.25916 + dVar3 * -0.33151 + dVar2 * -0.45086 + 1.8106);
    uVar1 = std::isnan(local_28);
    if (((uVar1 & 1) != 0) || (local_28 <= 0.0)) {
      local_28 = 100.0;
    }
  }
  return local_28;
}

Assistant:

double LArNEST::GetLinearEnergyTransfer(double energy, bool CSDA) {
  double LET;
  if (!CSDA) {  // total stopping power directly from ESTAR (radiative +
                // collision)
    LET = 1.8106 - 0.45086 * log10(energy) - 0.33151 * pow(log10(energy), 2.) +
          0.25916 * pow(log10(energy), 3.) - 0.2051 * pow(log10(energy), 4.) +
          0.15279 * pow(log10(energy), 5.) - 0.084659 * pow(log10(energy), 6.) +
          0.030441 * pow(log10(energy), 7.) -
          0.0058953 * pow(log10(energy), 8.) +
          0.00045633 * pow(log10(energy), 9.);
    LET = pow(10., LET);
    if (std::isnan(LET) || LET <= 0.) {
      LET = 1e2;
    }
  } else {
    // the "continuous slowing down approximation" (CSDA)
    // replace with Justin and Prof. Mooney's work
    if (energy >= 1.) {
      LET = 116.70 - 162.97 * log10(energy) + 99.361 * pow(log10(energy), 2) -
            33.405 * pow(log10(energy), 3) + 6.5069 * pow(log10(energy), 4) -
            0.69334 * pow(log10(energy), 5) + 0.031563 * pow(log10(energy), 6);
    } else if (energy > 0. && energy < 1.) {
      LET = 100.;
    } else {
      LET = 0.;
    }
  }
  return LET;
}